

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  char *str_00;
  Message *pMVar1;
  long in_FS_OFFSET;
  char *value_str;
  Int32 *value_local;
  char *str_local;
  Message local_20;
  char *local_18;
  char *flag_local;
  
  flag_local = *(char **)(in_FS_OFFSET + 0x28);
  local_18 = flag;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    Message::Message(&local_20);
    pMVar1 = Message::operator<<(&local_20,(char (*) [21])"The value of flag --");
    pMVar1 = Message::operator<<(pMVar1,&local_18);
    str_local._7_1_ = ParseInt32(pMVar1,str_00,value);
    Message::~Message(&local_20);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == flag_local) {
    return str_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}